

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vc1StreamReader.cpp
# Opt level: O2

int __thiscall
VC1StreamReader::getNextBFrames(VC1StreamReader *this,uint8_t *buffer,int64_t *bTiming)

{
  int iVar1;
  uint uVar2;
  uint8_t *puVar3;
  long lVar4;
  long lVar5;
  uint8_t *end;
  uint uVar6;
  char cVar7;
  uint local_84;
  VC1Frame frame;
  
  *bTiming = 0;
  puVar3 = VC1Unit::findNextMarker
                     (buffer,(this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd);
  uVar6 = 0;
  do {
    end = (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd;
    if (end + -4 <= puVar3) {
      uVar2 = 0xffffffff;
      if (((this->super_MPEGStreamReader).m_eof & 1U) != 0) {
        uVar2 = uVar6;
      }
      return uVar2;
    }
    if ((puVar3[3] & 0xef) == 0xd) {
      frame.super_VC1Unit.bitReader.super_BitStream.m_totalBits = 0;
      frame.tff = 0;
      frame.rff = 0;
      frame.rptfrmBitPos = 0;
      frame.super_VC1Unit.m_nalBufferLen = 0;
      frame.fcm = 0;
      frame.pict_type = I_TYPE;
      frame.super_VC1Unit.bitReader.m_curVal = 0;
      frame.super_VC1Unit.bitReader.m_bitLeft = 0;
      frame.super_VC1Unit.m_nalBuffer = (uint8_t *)0x0;
      frame.super_VC1Unit.bitReader.super_BitStream.m_buffer = (uint *)0x0;
      frame.super_VC1Unit.bitReader.super_BitStream.m_initBuffer = (uint *)0x0;
      frame.rptfrm = '\0';
      iVar1 = VC1Frame::decode_frame_direct(&frame,&this->m_sequence,puVar3 + 4,end);
      if (iVar1 == 0) {
        if (frame.pict_type < B_TYPE) {
          cVar7 = '\x01';
          local_84 = uVar6;
        }
        else {
          lVar4 = (this->super_MPEGStreamReader).m_pcrIncPerFrame;
          if ((this->m_sequence).pulldown != 0) {
            if (((this->m_sequence).interlace == true) && ((this->m_sequence).psf == 0)) {
              if (frame.rff == 0) {
                lVar5 = 0;
              }
              else {
                lVar5 = (this->super_MPEGStreamReader).m_pcrIncPerField;
              }
              lVar4 = lVar4 + lVar5;
            }
            else {
              lVar4 = lVar4 * ((ulong)frame.rptfrm + 1);
            }
          }
          *bTiming = *bTiming + lVar4;
          uVar6 = uVar6 + 1;
          cVar7 = uVar6 == (this->m_sequence).max_b_frames;
          if ((bool)cVar7) {
            local_84 = uVar6;
          }
        }
      }
      else {
        cVar7 = '\x02';
      }
      VC1Unit::~VC1Unit(&frame.super_VC1Unit);
      if (cVar7 != '\0') {
        uVar2 = 0xffffffff;
        if (((this->super_MPEGStreamReader).m_eof & 1U) != 0) {
          uVar2 = uVar6;
        }
        if (cVar7 != '\x02') {
          return local_84;
        }
        return uVar2;
      }
      end = (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd;
    }
    puVar3 = VC1Unit::findNextMarker(puVar3 + 4,end);
  } while( true );
}

Assistant:

int VC1StreamReader::getNextBFrames(uint8_t* buffer, int64_t& bTiming) const
{
    int bFrameCnt = 0;
    bTiming = 0;
    for (uint8_t* nal = VC1Unit::findNextMarker(buffer, m_bufEnd); nal < m_bufEnd - 4;
         nal = VC1Unit::findNextMarker(nal + 4, m_bufEnd))
    {
        const auto vc1Code = static_cast<VC1Code>(nal[3]);
        if (vc1Code == VC1Code::FRAME || vc1Code == VC1Code::USER_FRAME)
        {
            VC1Frame frame;
            if (frame.decode_frame_direct(m_sequence, nal + 4, m_bufEnd) != 0)
                break;
            if (frame.pict_type == VC1PictType::I_TYPE || frame.pict_type == VC1PictType::P_TYPE)
                return bFrameCnt;
            bFrameCnt++;

            int64_t pcrIncVal = m_pcrIncPerFrame;

            if (m_sequence.pulldown)
            {
                if (!m_sequence.interlace || m_sequence.psf)
                {
                    pcrIncVal = pcrIncVal * (static_cast<int64_t>(frame.rptfrm) + 1);
                }
                else
                {
                    pcrIncVal += (frame.rff ? m_pcrIncPerField : 0);
                }
            }
            bTiming += pcrIncVal;

            if (bFrameCnt == m_sequence.max_b_frames)
                return bFrameCnt;
        }
    }
    if (m_eof)
    {
        return bFrameCnt;
    }
    return -1;
}